

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_prn.cc
# Opt level: O3

int unknown_ext_print(BIO *out,X509_EXTENSION *ext,unsigned_long flag,int indent,int supported)

{
  int iVar1;
  ASN1_OCTET_STRING *str;
  uchar *data;
  uint uVar2;
  char *format;
  
  uVar2 = (uint)(flag >> 0x10) & 0xf;
  if (1 < (ulong)uVar2 - 2) {
    if ((ulong)uVar2 == 0) {
      iVar1 = 0;
    }
    else {
      if (uVar2 == 1) {
        if (supported == 0) {
          format = "%*s<Not Supported>";
        }
        else {
          format = "%*s<Parse Error>";
        }
        BIO_printf((BIO *)out,format,(ulong)(uint)indent,"");
      }
      iVar1 = 1;
    }
    return iVar1;
  }
  str = X509_EXTENSION_get_data((X509_EXTENSION *)ext);
  data = ASN1_STRING_get0_data((ASN1_STRING *)str);
  iVar1 = ASN1_STRING_length(str);
  iVar1 = BIO_hexdump(out,data,(long)iVar1,indent);
  return iVar1;
}

Assistant:

static int unknown_ext_print(BIO *out, const X509_EXTENSION *ext,
                             unsigned long flag, int indent, int supported) {
  switch (flag & X509V3_EXT_UNKNOWN_MASK) {
    case X509V3_EXT_DEFAULT:
      return 0;

    case X509V3_EXT_ERROR_UNKNOWN:
      if (supported) {
        BIO_printf(out, "%*s<Parse Error>", indent, "");
      } else {
        BIO_printf(out, "%*s<Not Supported>", indent, "");
      }
      return 1;

    case X509V3_EXT_PARSE_UNKNOWN:
    case X509V3_EXT_DUMP_UNKNOWN: {
      const ASN1_STRING *data = X509_EXTENSION_get_data(ext);
      return BIO_hexdump(out, ASN1_STRING_get0_data(data),
                         ASN1_STRING_length(data), indent);
    }

    default:
      return 1;
  }
}